

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessRTCPReportBlock
          (RTPSources *this,uint32_t ssrc,uint8_t fractionlost,int32_t lostpackets,
          uint32_t exthighseqnr,uint32_t jitter,uint32_t lsr,uint32_t dlsr,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  bool local_39;
  int status;
  bool created;
  RTPInternalSourceData *srcdat;
  uint32_t local_28;
  uint32_t jitter_local;
  uint32_t exthighseqnr_local;
  int32_t lostpackets_local;
  uint8_t fractionlost_local;
  RTPSources *pRStack_18;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  srcdat._4_4_ = jitter;
  local_28 = exthighseqnr;
  jitter_local = lostpackets;
  exthighseqnr_local._3_1_ = fractionlost;
  lostpackets_local = ssrc;
  pRStack_18 = this;
  this_local._4_4_ =
       GetRTCPSourceData(this,ssrc,senderaddress,(RTPInternalSourceData **)&status,&local_39);
  if (-1 < this_local._4_4_) {
    if (_status == (RTPInternalSourceData *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      RTPInternalSourceData::ProcessReportBlock
                (_status,exthighseqnr_local._3_1_,jitter_local,local_28,srcdat._4_4_,lsr,dlsr,
                 receivetime);
      if ((local_39 & 1U) != 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,_status);
      }
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xc])(this,_status);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::ProcessRTCPReportBlock(uint32_t ssrc,uint8_t fractionlost,int32_t lostpackets,
                           uint32_t exthighseqnr,uint32_t jitter,uint32_t lsr,
			   uint32_t dlsr,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;
	
	srcdat->ProcessReportBlock(fractionlost,lostpackets,exthighseqnr,jitter,lsr,dlsr,receivetime);

	// Call the callback
	if (created)
		OnNewSource(srcdat);

	OnRTCPReceiverReport(srcdat);
			
	return 0;
}